

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void cmFindPackageCommand::Sort
               (iterator begin,iterator end,SortOrderType order,SortDirectionType dir)

{
  long lVar1;
  ulong uVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  
  if (order == Natural) {
    if (dir == Dec) {
      if (begin._M_current != end._M_current) {
        uVar2 = (long)end._M_current - (long)begin._M_current >> 5;
        lVar1 = 0x3f;
        if (uVar2 != 0) {
          for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::StrverscmpOp<std::greater>>>
                  (begin._M_current,end._M_current,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)end._M_current - (long)begin._M_current < 0x201) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::StrverscmpOp<std::greater>>>
                    (begin._M_current,end._M_current);
          return;
        }
        pbVar3 = begin._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::StrverscmpOp<std::greater>>>
                  (begin._M_current,pbVar3);
        for (; pbVar3 != end._M_current; pbVar3 = pbVar3 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::StrverscmpOp<std::greater>>>
                    (pbVar3);
        }
      }
    }
    else if (begin._M_current != end._M_current) {
      uVar2 = (long)end._M_current - (long)begin._M_current >> 5;
      lVar1 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::StrverscmpOp<std::less>>>
                (begin._M_current,end._M_current,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)end._M_current - (long)begin._M_current < 0x201) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::StrverscmpOp<std::less>>>
                  (begin._M_current,end._M_current);
        return;
      }
      pbVar3 = begin._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::StrverscmpOp<std::less>>>
                (begin._M_current,pbVar3);
      for (; pbVar3 != end._M_current; pbVar3 = pbVar3 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::StrverscmpOp<std::less>>>
                  (pbVar3);
      }
    }
  }
  else if (order == Name_order) {
    if (dir == Dec) {
      if (begin._M_current != end._M_current) {
        uVar2 = (long)end._M_current - (long)begin._M_current >> 5;
        lVar1 = 0x3f;
        if (uVar2 != 0) {
          for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::__cxx11::string>>>
                  (begin._M_current,end._M_current,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::__cxx11::string>>>
                  (begin._M_current,end._M_current);
        return;
      }
    }
    else if (begin._M_current != end._M_current) {
      uVar2 = (long)end._M_current - (long)begin._M_current >> 5;
      lVar1 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (begin._M_current,end._M_current,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (begin._M_current,end._M_current);
      return;
    }
  }
  return;
}

Assistant:

void cmFindPackageCommand::Sort(std::vector<std::string>::iterator begin,
                                std::vector<std::string>::iterator end,
                                SortOrderType const order,
                                SortDirectionType const dir)
{
  if (order == Name_order) {
    if (dir == Dec) {
      std::sort(begin, end, std::greater<std::string>());
    } else {
      std::sort(begin, end);
    }
  } else if (order == Natural) {
    // natural order uses letters and numbers (contiguous numbers digit are
    // compared such that e.g. 000  00 < 01 < 010 < 09 < 0 < 1 < 9 < 10
    if (dir == Dec) {
      std::sort(begin, end, StrverscmpOp<std::greater>());
    } else {
      std::sort(begin, end, StrverscmpOp<std::less>());
    }
  }
  // else do not sort
}